

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::RadixPartitionedHashTable::GetData
          (RadixPartitionedHashTable *this,ExecutionContext *context,DataChunk *chunk,
          GlobalSinkState *sink_p,OperatorSourceInput *input)

{
  RadixHTGlobalSourceState *this_00;
  RadixHTLocalSourceState *lstate;
  size_type *psVar1;
  size_type __n;
  aggregate_finalize_t p_Var2;
  aggregate_destructor_t p_Var3;
  SourceResultType SVar4;
  reference pvVar5;
  Allocator *allocator_00;
  const_reference this_01;
  pointer this_02;
  BoundAggregateExpression *pBVar6;
  idx_t iVar7;
  const_reference value;
  size_type *psVar8;
  GroupedAggregateData *pGVar9;
  idx_t i;
  ulong uVar10;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false> aggr_state;
  AggregateInputData aggr_input_data;
  ArenaAllocator allocator;
  Vector state_vector;
  Value local_70;
  
  this_00 = (RadixHTGlobalSourceState *)input->global_state;
  lstate = (RadixHTLocalSourceState *)input->local_state;
  SVar4 = FINISHED;
  if (((this_00->finished)._M_base._M_i & 1U) == 0) {
    if (sink_p[3].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__align == 0) {
      if ((this->grouping_set->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
        chunk->count = 1;
        psVar1 = (this->null_groups).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (psVar8 = (this->null_groups).
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start; psVar8 != psVar1; psVar8 = psVar8 + 1) {
          __n = *psVar8;
          pvVar5 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,__n);
          Vector::SetVectorType(pvVar5,CONSTANT_VECTOR);
          pvVar5 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,__n);
          ConstantVector::SetNull(pvVar5,true);
        }
        allocator_00 = BufferAllocator::Get(context->client);
        ArenaAllocator::ArenaAllocator(&allocator,allocator_00,0x800);
        for (uVar10 = 0; pGVar9 = this->op,
            uVar10 < (ulong)((long)(pGVar9->aggregates).
                                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pGVar9->aggregates).
                                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
            uVar10 = uVar10 + 1) {
          this_01 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::get<true>(&pGVar9->aggregates,uVar10);
          this_02 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(this_01);
          pBVar6 = BaseExpression::Cast<duckdb::BoundAggregateExpression>
                             (&this_02->super_BaseExpression);
          iVar7 = (*(pBVar6->function).state_size)(&pBVar6->function);
          aggr_state.super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
               (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
               operator_new__(iVar7);
          (*(pBVar6->function).initialize)
                    (&pBVar6->function,
                     (data_ptr_t)
                     aggr_state.
                     super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
          aggr_input_data.bind_data.ptr =
               (pBVar6->bind_info).
               super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
               _M_t.
               super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
               .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
          aggr_input_data.allocator = &allocator;
          aggr_input_data.combine_type = PRESERVE_INPUT;
          Value::POINTER(&local_70,
                         (uintptr_t)
                         aggr_state.
                         super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
          Vector::Vector(&state_vector,&local_70);
          Value::~Value(&local_70);
          p_Var2 = (pBVar6->function).finalize;
          pvVar5 = vector<duckdb::Vector,_true>::get<true>
                             (&chunk->data,
                              ((long)(this->null_groups).
                                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->null_groups).
                                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) + uVar10);
          (*p_Var2)(&state_vector,&aggr_input_data,pvVar5,1,0);
          p_Var3 = (pBVar6->function).destructor;
          if (p_Var3 != (aggregate_destructor_t)0x0) {
            (*p_Var3)(&state_vector,&aggr_input_data,1);
          }
          Vector::~Vector(&state_vector);
          ::std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                    (&aggr_state.
                      super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>);
        }
        for (uVar10 = 0;
            uVar10 < (ulong)(((long)(pGVar9->grouping_functions).
                                    super_vector<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pGVar9->grouping_functions).
                                   super_vector<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
            uVar10 = uVar10 + 1) {
          pvVar5 = vector<duckdb::Vector,_true>::get<true>
                             (&chunk->data,
                              ((long)(pGVar9->aggregates).
                                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pGVar9->aggregates).
                                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) +
                              ((long)(this->null_groups).
                                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->null_groups).
                                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) + uVar10);
          value = vector<duckdb::Value,_true>::get<true>(&this->grouping_values,uVar10);
          Vector::Reference(pvVar5,value);
          pGVar9 = this->op;
        }
        ArenaAllocator::~ArenaAllocator(&allocator);
      }
      SVar4 = FINISHED;
      LOCK();
      (this_00->finished)._M_base._M_i = true;
      UNLOCK();
    }
    else {
      while ((((this_00->finished)._M_base._M_i & 1U) == 0 && (chunk->count == 0))) {
        if (((lstate->task != SCAN) || (lstate->scan_status == DONE)) &&
           (SVar4 = RadixHTGlobalSourceState::AssignTask
                              (this_00,(RadixHTGlobalSinkState *)sink_p,lstate,
                               input->interrupt_state), SVar4 != HAVE_MORE_OUTPUT)) {
          return SVar4;
        }
        RadixHTLocalSourceState::ExecuteTask(lstate,(RadixHTGlobalSinkState *)sink_p,this_00,chunk);
      }
      SVar4 = chunk->count == 0;
    }
  }
  return SVar4;
}

Assistant:

SourceResultType RadixPartitionedHashTable::GetData(ExecutionContext &context, DataChunk &chunk,
                                                    GlobalSinkState &sink_p, OperatorSourceInput &input) const {
	auto &sink = sink_p.Cast<RadixHTGlobalSinkState>();
	D_ASSERT(sink.finalized);

	auto &gstate = input.global_state.Cast<RadixHTGlobalSourceState>();
	auto &lstate = input.local_state.Cast<RadixHTLocalSourceState>();
	D_ASSERT(sink.scan_pin_properties == TupleDataPinProperties::UNPIN_AFTER_DONE ||
	         sink.scan_pin_properties == TupleDataPinProperties::DESTROY_AFTER_DONE);

	if (gstate.finished) {
		return SourceResultType::FINISHED;
	}

	if (sink.count_before_combining == 0) {
		if (grouping_set.empty()) {
			// Special case hack to sort out aggregating from empty intermediates for aggregations without groups
			D_ASSERT(chunk.ColumnCount() == null_groups.size() + op.aggregates.size() + op.grouping_functions.size());
			// For each column in the aggregates, set to initial state
			chunk.SetCardinality(1);
			for (auto null_group : null_groups) {
				chunk.data[null_group].SetVectorType(VectorType::CONSTANT_VECTOR);
				ConstantVector::SetNull(chunk.data[null_group], true);
			}
			ArenaAllocator allocator(BufferAllocator::Get(context.client));
			for (idx_t i = 0; i < op.aggregates.size(); i++) {
				D_ASSERT(op.aggregates[i]->GetExpressionClass() == ExpressionClass::BOUND_AGGREGATE);
				auto &aggr = op.aggregates[i]->Cast<BoundAggregateExpression>();
				auto aggr_state = make_unsafe_uniq_array_uninitialized<data_t>(aggr.function.state_size(aggr.function));
				aggr.function.initialize(aggr.function, aggr_state.get());

				AggregateInputData aggr_input_data(aggr.bind_info.get(), allocator);
				Vector state_vector(Value::POINTER(CastPointerToValue(aggr_state.get())));
				aggr.function.finalize(state_vector, aggr_input_data, chunk.data[null_groups.size() + i], 1, 0);
				if (aggr.function.destructor) {
					aggr.function.destructor(state_vector, aggr_input_data, 1);
				}
			}
			// Place the grouping values (all the groups of the grouping_set condensed into a single value)
			// Behind the null groups + aggregates
			for (idx_t i = 0; i < op.grouping_functions.size(); i++) {
				chunk.data[null_groups.size() + op.aggregates.size() + i].Reference(grouping_values[i]);
			}
		}
		gstate.finished = true;
		return SourceResultType::FINISHED;
	}

	while (!gstate.finished && chunk.size() == 0) {
		if (lstate.TaskFinished()) {
			const auto res = gstate.AssignTask(sink, lstate, input.interrupt_state);
			if (res != SourceResultType::HAVE_MORE_OUTPUT) {
				D_ASSERT(res == SourceResultType::FINISHED || res == SourceResultType::BLOCKED);
				return res;
			}
		}
		lstate.ExecuteTask(sink, gstate, chunk);
	}

	if (chunk.size() != 0) {
		return SourceResultType::HAVE_MORE_OUTPUT;
	} else {
		return SourceResultType::FINISHED;
	}
}